

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O3

string * __thiscall
common_arg::to_string_abi_cxx11_(string *__return_storage_ptr__,common_arg *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  pointer pcVar3;
  int iVar4;
  pointer pbVar5;
  long lVar6;
  string *psVar7;
  char cVar8;
  size_t sVar9;
  long *plVar10;
  long lVar11;
  istream *piVar12;
  ostream *poVar13;
  long *plVar14;
  char *pcVar15;
  pointer ppcVar16;
  pointer pbVar17;
  bool bVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  help_lines;
  string leading_spaces;
  string word;
  string current_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmp;
  string spaces;
  ostringstream ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_588;
  long *local_570;
  long local_568;
  long local_560 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  value_type local_530;
  value_type local_510;
  long *local_4f0 [2];
  long local_4e0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  string *local_4b0;
  long *local_4a8;
  long local_4a0;
  long local_498;
  long lStack_490;
  ios_base local_430 [264];
  long *local_328;
  long local_320;
  long local_318 [13];
  ios_base local_2b0 [264];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_570 = local_560;
  local_4b0 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)&local_570,'(');
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  ppcVar16 = (this->args).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppcVar1 = (this->args).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar16 != ppcVar1) {
    do {
      pcVar15 = *ppcVar16;
      ppcVar2 = (this->args).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                .super__Vector_impl_data._M_start;
      if (pcVar15 == *ppcVar2) {
        if ((long)(this->args).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar2 == 8) {
          if (pcVar15 != (char *)0x0) {
            sVar9 = strlen(pcVar15);
            goto LAB_0012dacb;
          }
          std::ios::clear((int)&local_588 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x3e0);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_328,pcVar15,(allocator<char> *)&local_550);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_328);
          local_4a8 = &local_498;
          plVar14 = plVar10 + 2;
          if ((long *)*plVar10 == plVar14) {
            local_498 = *plVar14;
            lStack_490 = plVar10[3];
          }
          else {
            local_498 = *plVar14;
            local_4a8 = (long *)*plVar10;
          }
          local_4a0 = plVar10[1];
          *plVar10 = (long)plVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          if (local_328 != local_318) {
            operator_delete(local_328,local_318[0] + 1);
          }
          iVar4 = 7 - (int)local_4a0;
          if (7 - (int)local_4a0 < 1) {
            iVar4 = 0;
          }
          local_328 = local_318;
          std::__cxx11::string::_M_construct((ulong)&local_328,(char)iVar4);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_4a8,local_4a0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)local_328,local_320);
          if (local_328 != local_318) {
            operator_delete(local_328,local_318[0] + 1);
          }
          if (local_4a8 != &local_498) {
            operator_delete(local_4a8,local_498 + 1);
          }
        }
      }
      else {
        if (pcVar15 == (char *)0x0) {
          std::ios::clear((int)&local_588 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x3e0);
        }
        else {
          sVar9 = strlen(pcVar15);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar15,sVar9);
        }
        bVar18 = pcVar15 !=
                 (this->args).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish[-1];
        pcVar15 = ", ";
        if (!bVar18) {
          pcVar15 = "";
        }
        sVar9 = (size_t)((uint)bVar18 * 2);
LAB_0012dacb:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar15,sVar9);
      }
      ppcVar16 = ppcVar16 + 1;
    } while (ppcVar16 != ppcVar1);
  }
  if (this->value_hint != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    pcVar15 = this->value_hint;
    if (pcVar15 == (char *)0x0) {
      std::ios::clear((int)&local_588 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x3e0);
    }
    else {
      sVar9 = strlen(pcVar15);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar15,sVar9);
    }
  }
  if (this->value_hint_2 != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    pcVar15 = this->value_hint_2;
    if (pcVar15 == (char *)0x0) {
      std::ios::clear((int)&local_588 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x3e0);
    }
    else {
      sVar9 = strlen(pcVar15);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar15,sVar9);
    }
  }
  lVar11 = std::ostream::tellp();
  lVar6 = local_568;
  if (lVar11 < 0x26) {
    cVar8 = std::ostream::tellp();
    local_4a8 = &local_498;
    std::__cxx11::string::_M_construct((ulong)&local_4a8,(char)lVar6 - cVar8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)local_4a8,local_4a0);
    if (local_4a8 != &local_498) {
      operator_delete(local_4a8,local_498 + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)local_570,local_568);
  }
  local_4f0[0] = local_4e0;
  pcVar3 = (this->help)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4f0,pcVar3,pcVar3 + (this->help)._M_string_length);
  local_588.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_588.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_588.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::istringstream::istringstream((istringstream *)&local_328,(string *)local_4f0,_S_in);
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  local_510._M_string_length = 0;
  local_510.field_2._M_local_buf[0] = '\0';
  while( true ) {
    cVar8 = std::ios::widen((char)local_328[-3] + (char)&local_328);
    piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&local_328,(string *)&local_510,cVar8);
    if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) break;
    if (local_510._M_string_length < 0x47) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_588,&local_510);
    }
    else {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&local_4a8,(string *)&local_510,_S_in);
      local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
      local_550._M_string_length = 0;
      local_550.field_2._M_local_buf[0] = '\0';
      local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
      local_530._M_string_length = 0;
      local_530.field_2._M_local_buf[0] = '\0';
      while (piVar12 = std::operator>>((istream *)&local_4a8,(string *)&local_550),
            ((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) == 0) {
        if (((local_530._M_string_length + 1) - (ulong)(local_530._M_string_length == 0)) +
            local_550._M_string_length < 0x47) {
          pcVar15 = "";
          if (local_530._M_string_length != 0) {
            pcVar15 = " ";
          }
          std::operator+(&local_4d0,pcVar15,&local_550);
          std::__cxx11::string::_M_append((char *)&local_530,(ulong)local_4d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
            operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          if (local_530._M_string_length != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_588,&local_530);
          }
          std::__cxx11::string::_M_assign((string *)&local_530);
        }
      }
      if (local_530._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_588,&local_530);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != &local_530.field_2) {
        operator_delete(local_530._M_dataplus._M_p,
                        CONCAT71(local_530.field_2._M_allocated_capacity._1_7_,
                                 local_530.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_550._M_dataplus._M_p != &local_550.field_2) {
        operator_delete(local_550._M_dataplus._M_p,
                        CONCAT71(local_550.field_2._M_allocated_capacity._1_7_,
                                 local_550.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&local_4a8);
      std::ios_base::~ios_base(local_430);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,
                    CONCAT71(local_510.field_2._M_allocated_capacity._1_7_,
                             local_510.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&local_328);
  std::ios_base::~ios_base(local_2b0);
  if (local_4f0[0] != local_4e0) {
    operator_delete(local_4f0[0],local_4e0[0] + 1);
  }
  pbVar5 = local_588.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_588.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_588.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar17 = local_588.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_4a8 = &local_498;
      if (pbVar17 ==
          local_588.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
      }
      else {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4a8,local_570,(long)local_570 + local_568);
      }
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(char *)local_4a8,local_4a0);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,(pbVar17->_M_dataplus)._M_p,pbVar17->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
      if (local_4a8 != &local_498) {
        operator_delete(local_4a8,local_498 + 1);
      }
      pbVar17 = pbVar17 + 1;
    } while (pbVar17 != pbVar5);
  }
  psVar7 = local_4b0;
  std::__cxx11::stringbuf::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_588);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_570 != local_560) {
    operator_delete(local_570,local_560[0] + 1);
  }
  return psVar7;
}

Assistant:

std::string common_arg::to_string() {
    // params for printing to console
    const static int n_leading_spaces = 40;
    const static int n_char_per_line_help = 70; // TODO: detect this based on current console
    std::string leading_spaces(n_leading_spaces, ' ');

    std::ostringstream ss;
    for (const auto arg : args) {
        if (arg == args.front()) {
            if (args.size() == 1) {
                ss << arg;
            } else {
                // first arg is usually abbreviation, we need padding to make it more beautiful
                auto tmp = std::string(arg) + ", ";
                auto spaces = std::string(std::max(0, 7 - (int)tmp.size()), ' ');
                ss << tmp << spaces;
            }
        } else {
            ss << arg << (arg != args.back() ? ", " : "");
        }
    }
    if (value_hint) ss << " " << value_hint;
    if (value_hint_2) ss << " " << value_hint_2;
    if (ss.tellp() > n_leading_spaces - 3) {
        // current line is too long, add new line
        ss << "\n" << leading_spaces;
    } else {
        // padding between arg and help, same line
        ss << std::string(leading_spaces.size() - ss.tellp(), ' ');
    }
    const auto help_lines = break_str_into_lines(help, n_char_per_line_help);
    for (const auto & line : help_lines) {
        ss << (&line == &help_lines.front() ? "" : leading_spaces) << line << "\n";
    }
    return ss.str();
}